

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsSetup(ARKodeMem ark_mem,int convfail,sunrealtype tpred,N_Vector ypred,N_Vector fpred,
              int *jcurPtr,N_Vector vtemp1,N_Vector vtemp2,N_Vector vtemp3)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  ARKodeMem in_RDI;
  int *in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  int retval;
  int *jcur;
  int dgamma_fail;
  sunrealtype gamrat;
  sunrealtype gamma;
  SUNMatrix M;
  void *ark_step_massmem;
  ARKLsMem arkls_mem;
  ARKLsMem *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  ARKodeMem in_stack_ffffffffffffff58;
  N_Vector in_stack_ffffffffffffff60;
  N_Vector in_stack_ffffffffffffff68;
  undefined3 uVar4;
  undefined4 in_stack_ffffffffffffff70;
  ARKodeMem in_stack_ffffffffffffff78;
  int local_7c;
  sunrealtype local_78;
  sunrealtype local_70;
  undefined8 local_68;
  void *local_60;
  long local_58;
  undefined8 local_50;
  int *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_24;
  ARKodeMem local_20;
  int local_14;
  uint uVar5;
  
  local_58 = 0;
  local_60 = (void *)0x0;
  local_68 = 0;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_38 = in_RDX;
  local_30 = in_XMM0_Qa;
  local_24 = in_ESI;
  local_20 = in_RDI;
  iVar1 = arkLs_AccessLMem(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48);
  local_14 = iVar1;
  if (iVar1 == 0) {
    iVar2 = SUNLinSolGetType(*(undefined8 *)(local_58 + 0x38));
    if (iVar2 == 3) {
      *(undefined4 *)(local_58 + 0x130) = 0;
      local_14 = *(int *)(local_58 + 0x130);
    }
    else {
      *(undefined8 *)(local_58 + 0x78) = local_30;
      *(undefined8 *)(local_58 + 0x60) = local_38;
      *(undefined8 *)(local_58 + 0x68) = local_40;
      iVar2 = (*local_20->step_getgammas)
                        (local_20,&local_70,&local_78,(int **)&stack0xffffffffffffff78,&local_7c);
      *(int *)(local_58 + 0x130) = iVar2;
      if (*(int *)(local_58 + 0x130) == 0) {
        uVar4 = (undefined3)in_stack_ffffffffffffff70;
        uVar5 = CONCAT13(1,uVar4);
        if (((local_20->initsetup == 0) &&
            (uVar5 = CONCAT13(1,uVar4),
            local_20->nst < *(long *)(local_58 + 0x90) + *(long *)(local_58 + 0x70))) &&
           ((local_24 != 1 || (uVar5 = CONCAT13(1,uVar4), local_7c != 0)))) {
          uVar5 = CONCAT13(local_24 == 2,uVar4);
        }
        *(uint *)(local_58 + 0x20) = uVar5 >> 0x18;
        if (local_20->step_getmassmem != (ARKTimestepGetMassMemFn)0x0) {
          local_60 = (*local_20->step_getmassmem)(local_20);
        }
        if (local_60 != (void *)0x0) {
          local_68 = *(undefined8 *)((long)local_60 + 0x10);
          iVar1 = arkLsMassSetup(in_stack_ffffffffffffff78,(sunrealtype)CONCAT44(iVar1,uVar5),
                                 in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                 (N_Vector)in_stack_ffffffffffffff58);
          *(int *)(local_58 + 0x130) = iVar1;
          if (*(int *)(local_58 + 0x130) != 0) {
            arkProcessError(local_20,-0xb,0xc9a,"arkLsSetup",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"Error setting up mass-matrix linear solver");
            return *(int *)(local_58 + 0x130);
          }
        }
        if (*(long *)(local_58 + 0x40) == 0) {
          *local_48 = *(int *)(local_58 + 0x20);
        }
        else {
          iVar1 = (**(code **)(local_58 + 0x120))
                            (local_30,local_70,local_38,local_40,*(undefined8 *)(local_58 + 0x40),
                             local_68,(*(int *)(local_58 + 0x20) != 0 ^ 0xffU) & 1,local_48,
                             *(undefined8 *)(local_58 + 0x128),local_50,in_stack_00000008,
                             in_stack_00000010);
          if (*local_48 != 0) {
            *(long *)(local_58 + 0x80) = *(long *)(local_58 + 0x80) + 1;
            *(long *)(local_58 + 0x90) = local_20->nst;
            *(undefined8 *)(local_58 + 200) = local_30;
          }
          if (iVar1 != 0) {
            if (*(int *)(local_58 + 0x118) == 0) {
              return iVar1;
            }
            if (iVar1 < 0) {
              arkProcessError(local_20,-7,0xcb7,"arkLsSetup",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                              ,"The Jacobian routine failed in an unrecoverable manner.");
              *(undefined4 *)(local_58 + 0x130) = 0xfffffff9;
              return -1;
            }
            *(undefined4 *)(local_58 + 0x130) = 0xfffffff8;
            return 1;
          }
        }
        uVar3 = SUNLinSolSetup(*(undefined8 *)(local_58 + 0x38),*(undefined8 *)(local_58 + 0x40));
        *(undefined4 *)(local_58 + 0x130) = uVar3;
        if (*(long *)(local_58 + 0x40) == 0) {
          if (*local_48 != 0) {
            *(long *)(local_58 + 0x98) = *(long *)(local_58 + 0x98) + 1;
            *(long *)(local_58 + 0x90) = local_20->nst;
            *(undefined8 *)(local_58 + 200) = local_30;
          }
          if (*(int *)(local_58 + 0x20) != 0) {
            *local_48 = 1;
          }
        }
        local_14 = *(int *)(local_58 + 0x130);
      }
      else {
        arkProcessError(local_20,(int)(ulong)*(uint *)(local_58 + 0x130),0xc7d,"arkLsSetup",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"An error occurred in ark_step_getgammas");
        local_14 = *(int *)(local_58 + 0x130);
      }
    }
  }
  return local_14;
}

Assistant:

int arkLsSetup(ARKodeMem ark_mem, int convfail, sunrealtype tpred,
               N_Vector ypred, N_Vector fpred, sunbooleantype* jcurPtr,
               N_Vector vtemp1, N_Vector vtemp2, N_Vector vtemp3)
{
  ARKLsMem arkls_mem     = NULL;
  void* ark_step_massmem = NULL;
  SUNMatrix M            = NULL;
  sunrealtype gamma, gamrat;
  sunbooleantype dgamma_fail, *jcur;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Immediately return when using matrix-embedded linear solver */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    arkls_mem->last_flag = ARKLS_SUCCESS;
    return (arkls_mem->last_flag);
  }

  /* Set ARKLs time and N_Vector pointers to current time,
     solution and rhs */
  arkls_mem->tcur = tpred;
  arkls_mem->ycur = ypred;
  arkls_mem->fcur = fpred;

  /* get gamma values from time step module */
  arkls_mem->last_flag = ark_mem->step_getgammas(ark_mem, &gamma, &gamrat,
                                                 &jcur, &dgamma_fail);
  if (arkls_mem->last_flag)
  {
    arkProcessError(ark_mem, arkls_mem->last_flag, __LINE__, __func__, __FILE__,
                    "An error occurred in ark_step_getgammas");
    return (arkls_mem->last_flag);
  }

  /* Use initsetup, gamma/gammap, and convfail to set J/P eval. flag jok;
     Note: the "ARK_FAIL_BAD_J" test is asking whether the nonlinear
     solver converged due to a bad system Jacobian AND our gamma was
     fine, indicating that the J and/or P were invalid */
  arkls_mem->jbad = (ark_mem->initsetup) ||
                    (ark_mem->nst >= arkls_mem->nstlj + arkls_mem->msbj) ||
                    ((convfail == ARK_FAIL_BAD_J) && (!dgamma_fail)) ||
                    (convfail == ARK_FAIL_OTHER);

  /* Check for mass matrix module and setup mass matrix */
  if (ark_mem->step_getmassmem)
  {
    ark_step_massmem = ark_mem->step_getmassmem(ark_mem);
  }

  if (ark_step_massmem)
  {
    /* Set shortcut to the mass matrix (NULL if matrix-free) */
    M = ((ARKLsMassMem)ark_step_massmem)->M;

    /* Setup mass matrix linear solver (including recomputation of mass matrix) */
    arkls_mem->last_flag = arkLsMassSetup(ark_mem, tpred, vtemp1, vtemp2, vtemp3);
    if (arkls_mem->last_flag)
    {
      arkProcessError(ark_mem, ARKLS_SUNMAT_FAIL, __LINE__, __func__, __FILE__,
                      "Error setting up mass-matrix linear solver");
      return (arkls_mem->last_flag);
    }
  }

  /* Setup the linear system if necessary */
  if (arkls_mem->A != NULL)
  {
    /* Update J if appropriate and evaluate A = I-gamma*J or A = M-gamma*J */
    retval = arkls_mem->linsys(tpred, ypred, fpred, arkls_mem->A, M,
                               !(arkls_mem->jbad), jcurPtr, gamma,
                               arkls_mem->A_data, vtemp1, vtemp2, vtemp3);

    /* Update J eval count and step when J was last updated */
    if (*jcurPtr)
    {
      arkls_mem->nje++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Check linsys() return value and return if necessary */
    if (retval != ARKLS_SUCCESS)
    {
      if (arkls_mem->user_linsys)
      {
        if (retval < 0)
        {
          arkProcessError(ark_mem, ARKLS_JACFUNC_UNRECVR, __LINE__, __func__,
                          __FILE__, MSG_LS_JACFUNC_FAILED);
          arkls_mem->last_flag = ARKLS_JACFUNC_UNRECVR;
          return (-1);
        }
        else
        {
          arkls_mem->last_flag = ARKLS_JACFUNC_RECVR;
          return (1);
        }
      }
      else { return (retval); }
    }
  }
  else
  {
    /* Matrix-free case, set jcur to jbad */
    *jcurPtr = arkls_mem->jbad;
  }

  /* Call LS setup routine -- the LS may call arkLsPSetup, who will
     pass the heuristic suggestions above to the user code(s) */
  arkls_mem->last_flag = SUNLinSolSetup(arkls_mem->LS, arkls_mem->A);

  /* If the SUNMatrix was NULL, update heuristics flags */
  if (arkls_mem->A == NULL)
  {
    /* If user set jcur to SUNTRUE, increment npe and save nst value */
    if (*jcurPtr)
    {
      arkls_mem->npe++;
      arkls_mem->nstlj = ark_mem->nst;
      arkls_mem->tnlj  = tpred;
    }

    /* Update jcurPtr flag if we suggested an update */
    if (arkls_mem->jbad) { *jcurPtr = SUNTRUE; }
  }

  return (arkls_mem->last_flag);
}